

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O0

void __thiscall
fizplex::BaseTestRegularWithReordering_BaseMatrixTimesInverseIsIdentity_Test::TestBody
          (BaseTestRegularWithReordering_BaseMatrixTimesInverseIsIdentity_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *message;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ColMatrix inv;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  ColMatrix *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  AssertHelper local_120;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee8;
  ColMatrix *in_stack_ffffffffffffff40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff48;
  AssertHelper local_b0;
  Message local_a8 [13];
  AssertionResult local_40 [4];
  
  Base::get_inverse((Base *)in_stack_ffffffffffffff48.ptr_);
  ColMatrix::identity((size_t)in_stack_fffffffffffffee8.ptr_);
  ColMatrix::operator*((ColMatrix *)in_stack_ffffffffffffff48.ptr_,in_stack_ffffffffffffff40);
  testing::internal::EqHelper<false>::Compare<fizplex::ColMatrix,fizplex::ColMatrix>
            (in_RDI,(char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,
             (ColMatrix *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  ColMatrix::~ColMatrix((ColMatrix *)0x1c31eb);
  ColMatrix::~ColMatrix((ColMatrix *)0x1c31f8);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(local_40);
  if (!(bool)uVar1) {
    testing::Message::Message(local_a8);
    in_stack_fffffffffffffec8 =
         (ColMatrix *)testing::AssertionResult::failure_message((AssertionResult *)0x1c32b4);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x7e,(char *)in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::operator=(&local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message((Message *)0x1c3311);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c3369);
  ColMatrix::identity((size_t)in_stack_fffffffffffffee8.ptr_);
  ColMatrix::operator*((ColMatrix *)in_stack_ffffffffffffff48.ptr_,in_stack_ffffffffffffff40);
  testing::internal::EqHelper<false>::Compare<fizplex::ColMatrix,fizplex::ColMatrix>
            (in_RDI,(char *)CONCAT17(uVar1,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8,
             (ColMatrix *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  ColMatrix::~ColMatrix((ColMatrix *)0x1c33c8);
  ColMatrix::~ColMatrix((ColMatrix *)0x1c33d2);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff40);
  if (!bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffffee8);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1c347b);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&stack0xfffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message((Message *)0x1c34c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c3516);
  ColMatrix::~ColMatrix((ColMatrix *)0x1c3523);
  return;
}

Assistant:

TEST_F(BaseTestRegularWithReordering, BaseMatrixTimesInverseIsIdentity) {
  const auto inv = b.get_inverse();
  EXPECT_EQ(ColMatrix::identity(3), inv * m);
  EXPECT_EQ(ColMatrix::identity(3), m * inv);
}